

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QuasispeciesEdgeCalculator.cpp
# Opt level: O2

double __thiscall
QuasispeciesEdgeCalculator::singleOverlap
          (QuasispeciesEdgeCalculator *this,AlignmentRecord *ap1,AlignmentRecord *ap2,int strain1,
          int strain2,double MIN_OVERLAP,double cutoff)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  char cVar5;
  char cVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  ShortDnaSequence *pSVar11;
  vector<char,_std::allocator<char>_> *pvVar12;
  _Base_ptr p_Var13;
  size_t sVar14;
  const_iterator cVar15;
  mapped_type_conflict *pmVar16;
  _func_int **pp_Var17;
  pointer pcVar18;
  int iVar19;
  int iVar20;
  ulong uVar21;
  ulong uVar22;
  QuasispeciesEdgeCalculator *this_00;
  _Base_ptr p_Var23;
  long lVar24;
  ulong uVar25;
  ulong pos;
  ulong uVar26;
  long lVar27;
  ulong uVar28;
  ulong uVar29;
  double dVar30;
  double dVar31;
  _Base_ptr local_1a8;
  int j_global;
  double local_198;
  ulong local_190;
  _Base_ptr local_188;
  _Base_ptr local_180;
  undefined1 local_178 [32];
  undefined1 local_158 [56];
  _Base_ptr local_120;
  _Base_ptr local_118;
  int offset2;
  int offset1;
  _Base_ptr local_108;
  _Base_ptr local_100;
  _Base_ptr local_f8;
  _Base_ptr local_f0;
  _Base_ptr local_e8;
  ulong local_e0;
  _Base_ptr local_d8;
  ulong local_d0;
  int overlap;
  ShortDnaSequence sequence2;
  ShortDnaSequence sequence1;
  
  local_180 = (_Base_ptr)MIN_OVERLAP;
  local_158._32_8_ = this;
  local_118 = (_Base_ptr)cutoff;
  ShortDnaSequence::ShortDnaSequence(&sequence1);
  local_178._0_8_ = (_func_int **)0x0;
  local_178._8_8_ = (pointer)0x0;
  local_178._16_8_ = (pointer)0x0;
  this_00 = (QuasispeciesEdgeCalculator *)&sequence2;
  ShortDnaSequence::ShortDnaSequence((ShortDnaSequence *)this_00);
  local_158._0_8_ = (_func_int **)0x0;
  local_158._8_8_ = (pointer)0x0;
  local_158._16_8_ = (pointer)0x0;
  if (strain1 == 2) {
    uVar7 = AlignmentRecord::getStart2(ap1);
    uVar8 = AlignmentRecord::getEnd2(ap1);
    pSVar11 = AlignmentRecord::getSequence2(ap1);
    ShortDnaSequence::operator=(&sequence1,pSVar11);
    pvVar12 = AlignmentRecord::getCigar2Unrolled(ap1);
    this_00 = (QuasispeciesEdgeCalculator *)local_178;
    std::vector<char,_std::allocator<char>_>::operator=
              ((vector<char,_std::allocator<char>_> *)this_00,pvVar12);
  }
  else {
    uVar7 = 0;
    uVar8 = 0;
    if (strain1 == 1) {
      uVar7 = AlignmentRecord::getStart1(ap1);
      uVar8 = AlignmentRecord::getEnd1(ap1);
      pSVar11 = AlignmentRecord::getSequence1(ap1);
      ShortDnaSequence::operator=(&sequence1,pSVar11);
      pvVar12 = AlignmentRecord::getCigar1Unrolled(ap1);
      this_00 = (QuasispeciesEdgeCalculator *)local_178;
      std::vector<char,_std::allocator<char>_>::operator=
                ((vector<char,_std::allocator<char>_> *)this_00,pvVar12);
    }
  }
  if (strain2 == 2) {
    uVar9 = AlignmentRecord::getStart2(ap2);
    uVar22 = (ulong)uVar9;
    uVar9 = AlignmentRecord::getEnd2(ap2);
    pSVar11 = AlignmentRecord::getSequence2(ap2);
    ShortDnaSequence::operator=(&sequence2,pSVar11);
    pvVar12 = AlignmentRecord::getCigar2Unrolled(ap2);
    this_00 = (QuasispeciesEdgeCalculator *)local_158;
    std::vector<char,_std::allocator<char>_>::operator=
              ((vector<char,_std::allocator<char>_> *)this_00,pvVar12);
  }
  else {
    uVar22 = 0;
    uVar9 = 0;
    if (strain2 == 1) {
      uVar9 = AlignmentRecord::getStart1(ap2);
      uVar22 = (ulong)uVar9;
      uVar9 = AlignmentRecord::getEnd1(ap2);
      pSVar11 = AlignmentRecord::getSequence1(ap2);
      ShortDnaSequence::operator=(&sequence2,pSVar11);
      pvVar12 = AlignmentRecord::getCigar1Unrolled(ap2);
      this_00 = (QuasispeciesEdgeCalculator *)local_158;
      std::vector<char,_std::allocator<char>_>::operator=
                ((vector<char,_std::allocator<char>_> *)this_00,pvVar12);
    }
  }
  if ((int)uVar22 < (int)uVar7) {
    this_00 = (QuasispeciesEdgeCalculator *)&sequence1;
    std::swap<ShortDnaSequence>((ShortDnaSequence *)this_00,&sequence2);
    uVar3 = local_178._16_8_;
    uVar2 = local_178._8_8_;
    uVar1 = local_178._0_8_;
    local_178._16_8_ = local_158._16_8_;
    local_178._0_8_ = local_158._0_8_;
    local_178._8_8_ = local_158._8_8_;
    local_158._0_8_ = uVar1;
    local_158._8_8_ = uVar2;
    local_158._16_8_ = uVar3;
    uVar26 = uVar22;
    uVar22 = (ulong)uVar7;
    uVar7 = uVar9;
    uVar9 = uVar8;
  }
  else {
    uVar26 = (ulong)uVar7;
    uVar7 = uVar8;
  }
  offset1 = 0;
  offset2 = 0;
  overlap = 0;
  computeOffsets(this_00,(int)uVar26,(int)uVar22,uVar7,uVar9,&offset1,&offset2,&overlap);
  iVar4 = offset1;
  local_1a8 = (_Base_ptr)0x0;
  if ((double)local_180 <= (double)overlap) {
    p_Var23 = (_Base_ptr)(long)offset1;
    p_Var13 = (_Base_ptr)ShortDnaSequence::size(&sequence1);
    if ((p_Var23 < p_Var13) &&
       (uVar21 = (ulong)offset2, sVar14 = ShortDnaSequence::size(&sequence2), local_d0 = uVar22,
       uVar21 < sVar14)) {
      pos = 0;
      uVar22 = 0;
      uVar28 = 0;
      uVar21 = 0;
      while( true ) {
        do {
        } while ((ulong)(local_158._8_8_ - local_158._0_8_) <= uVar21 ||
                 (ulong)(local_178._8_8_ - local_178._0_8_) <= uVar28);
        cVar5 = *(char *)(local_178._0_8_ + uVar28);
        if ((((cVar5 != 'H') && (cVar5 != 'S')) && (*(char *)(local_158._0_8_ + uVar21) != 'H')) &&
           (*(char *)(local_158._0_8_ + uVar21) != 'S')) break;
        pos = pos + (cVar5 == 'S');
        lVar27 = uVar28 + (cVar5 == 'S');
        uVar28 = (ulong)(*(char *)(local_158._0_8_ + uVar21) == 'S');
        uVar22 = uVar22 + uVar28;
        lVar24 = uVar21 + uVar28;
        uVar28 = lVar27 + (ulong)(*(char *)(local_178._0_8_ + lVar27) == 'H');
        uVar21 = lVar24 + (ulong)(*(char *)(local_158._0_8_ + lVar24) == 'H');
      }
      local_178._24_8_ = local_158._32_8_ + 0x40;
      local_180 = &(((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                      *)(local_158._32_8_ + 0x40))->_M_t)._M_impl.super__Rb_tree_header._M_header;
      local_198 = 0.0;
      local_190 = 0;
      pp_Var17 = (_func_int **)local_178._0_8_;
      pcVar18 = (pointer)local_178._8_8_;
      iVar19 = 0;
      local_188 = p_Var23;
      local_e0 = uVar26;
      do {
        uVar26 = uVar28;
        iVar20 = iVar19;
        while( true ) {
          iVar20 = iVar20 + 1;
          iVar10 = (int)local_e0;
          if (iVar20 - iVar4 == 1) {
            local_158._24_8_ = 0.0;
            local_120 = (_Base_ptr)0x0;
            uVar26 = uVar28 + (uint)((int)local_188 - iVar19);
            goto LAB_0017901e;
          }
          if (uVar26 < (ulong)((long)pcVar18 - (long)pp_Var17)) break;
          uVar26 = uVar26 + 1;
        }
        if (*(char *)((long)pp_Var17 + uVar26) == 'I') {
LAB_00178fe8:
          pos = pos + 1;
        }
        else if (*(char *)((long)pp_Var17 + uVar26) == 'M') {
          if (((((double)local_118 != 1.0) || (NAN((double)local_118))) &&
              (j_global = iVar10 + (int)local_190, pp_Var17 = (_func_int **)local_178._0_8_,
              pcVar18 = (pointer)local_178._8_8_,
              (((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> *)
               (local_158._32_8_ + 0x40))->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left !=
              local_180)) &&
             (cVar15 = std::
                       _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                       ::find((_Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                               *)local_178._24_8_,&j_global),
             pp_Var17 = (_func_int **)local_178._0_8_, pcVar18 = (pointer)local_178._8_8_,
             cVar15._M_node != local_180)) {
            pmVar16 = std::
                      map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                      ::at((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                            *)local_178._24_8_,&j_global);
            dVar30 = log(*pmVar16);
            local_198 = local_198 + dVar30;
            pp_Var17 = (_func_int **)local_178._0_8_;
            pcVar18 = (pointer)local_178._8_8_;
          }
          local_190 = (ulong)((int)local_190 + 1);
          goto LAB_00178fe8;
        }
        uVar28 = uVar26 + 1;
        iVar19 = iVar20;
      } while( true );
    }
  }
  goto LAB_001794c8;
LAB_0017901e:
  uVar29 = uVar26;
  uVar25 = uVar21;
  uVar28 = uVar22;
  if (((((ulong)((long)pcVar18 - (long)pp_Var17) <= uVar29) ||
       ((ulong)(local_158._8_8_ - local_158._0_8_) <= uVar25)) ||
      ((*(char *)((long)pp_Var17 + uVar29) == 'S' ||
       ((*(char *)(local_158._0_8_ + uVar25) == 'S' ||
        (sVar14 = ShortDnaSequence::size(&sequence1), sVar14 <= pos)))))) ||
     (sVar14 = ShortDnaSequence::size(&sequence2), sVar14 <= uVar28)) goto LAB_0017943e;
  if (((double)local_118 != 1.0) || (NAN((double)local_118))) {
    cVar5 = *(char *)(local_178._0_8_ + uVar29);
    cVar6 = *(char *)(local_158._0_8_ + uVar25);
    pp_Var17 = (_func_int **)local_178._0_8_;
    pcVar18 = (pointer)local_178._8_8_;
    uVar22 = uVar28;
    if (cVar5 == cVar6) {
      if (cVar5 == 'D') {
        uVar21 = uVar25 + 1;
        uVar26 = uVar29 + 1;
        goto LAB_0017901e;
      }
      if ((cVar5 != 'M') && (cVar5 != 'I')) goto LAB_001793a7;
      local_1a8 = (_Base_ptr)ShortDnaSequence::qualityCorrect(&sequence1,pos);
      local_188 = (_Base_ptr)ShortDnaSequence::qualityCorrect(&sequence2,uVar28);
      cVar5 = ShortDnaSequence::operator[](&sequence1,pos);
      cVar6 = ShortDnaSequence::operator[](&sequence2,uVar28);
      local_158._48_8_ = (1.0 - (double)local_1a8) / 3.0;
      local_d8 = local_1a8;
      if (cVar5 != 'A') {
        local_d8 = (_Base_ptr)local_158._48_8_;
      }
      local_158._40_8_ = (1.0 - (double)local_188) / 3.0;
      local_e8 = local_188;
      if (cVar6 != 'A') {
        local_e8 = (_Base_ptr)local_158._40_8_;
      }
      cVar5 = ShortDnaSequence::operator[](&sequence1,pos);
      cVar6 = ShortDnaSequence::operator[](&sequence2,uVar28);
      local_f0 = local_1a8;
      if (cVar5 != 'C') {
        local_f0 = (_Base_ptr)local_158._48_8_;
      }
      local_f8 = local_188;
      if (cVar6 != 'C') {
        local_f8 = (_Base_ptr)local_158._40_8_;
      }
      cVar5 = ShortDnaSequence::operator[](&sequence1,pos);
      cVar6 = ShortDnaSequence::operator[](&sequence2,uVar28);
      local_100 = local_1a8;
      if (cVar5 != 'G') {
        local_100 = (_Base_ptr)local_158._48_8_;
      }
      local_108 = local_188;
      if (cVar6 != 'G') {
        local_108 = (_Base_ptr)local_158._40_8_;
      }
      cVar5 = ShortDnaSequence::operator[](&sequence1,pos);
      cVar6 = ShortDnaSequence::operator[](&sequence2,uVar28);
      if (cVar5 != 'T') {
        local_1a8 = (_Base_ptr)local_158._48_8_;
      }
      if (cVar6 != 'T') {
        local_188 = (_Base_ptr)local_158._40_8_;
      }
      dVar30 = log((double)local_100 * (double)local_108 +
                   (double)local_f0 * (double)local_f8 + (double)local_d8 * (double)local_e8 + 0.0 +
                   (double)local_1a8 * (double)local_188);
      local_198 = local_198 + dVar30;
      local_120 = (_Base_ptr)((double)local_120 + 1.0);
      uVar26 = uVar29 + 1;
      pos = pos + 1;
      pp_Var17 = (_func_int **)local_178._0_8_;
      pcVar18 = (pointer)local_178._8_8_;
      uVar22 = uVar28 + 1;
      uVar21 = uVar25 + 1;
      if (((ulong)(local_178._8_8_ - local_178._0_8_) <= uVar26) ||
         (*(char *)(local_178._0_8_ + uVar26) != 'M')) goto LAB_0017901e;
      local_190 = (ulong)((int)local_190 + 1);
    }
    else {
LAB_001793a7:
      if (*(bool *)(local_158._32_8_ + 0x38) != true) goto LAB_001794bf;
      uVar21 = uVar25;
      uVar26 = uVar29;
      if (cVar6 != 'M') {
        local_1a8 = (_Base_ptr)0x0;
        if (cVar5 != 'M') goto LAB_001794c8;
        if (cVar6 == 'I') {
          uVar22 = uVar28 + 1;
          uVar21 = uVar25 + 1;
        }
        else if (cVar6 == 'D') {
          pos = pos + 1;
          local_190 = (ulong)((int)local_190 + 1);
          uVar21 = uVar25 + 1;
          uVar26 = uVar29 + 1;
        }
        goto LAB_0017901e;
      }
      if (cVar5 == 'I') {
        pos = pos + 1;
        uVar26 = uVar29 + 1;
        goto LAB_0017901e;
      }
      if (cVar5 != 'D') goto LAB_0017901e;
    }
    local_158._24_8_ = ZEXT48((int)local_158._24_8_ + 1);
    pp_Var17 = (_func_int **)local_178._0_8_;
    pcVar18 = (pointer)local_178._8_8_;
    uVar22 = uVar28 + 1;
    uVar21 = uVar25 + 1;
    uVar26 = uVar29 + 1;
    goto LAB_0017901e;
  }
  cVar5 = ShortDnaSequence::operator[](&sequence1,pos);
  cVar6 = ShortDnaSequence::operator[](&sequence2,uVar28);
  if (cVar5 != cVar6) {
LAB_001794bf:
    local_1a8 = (_Base_ptr)0x0;
    goto LAB_001794c8;
  }
  pos = pos + 1;
  pp_Var17 = (_func_int **)local_178._0_8_;
  pcVar18 = (pointer)local_178._8_8_;
  uVar22 = uVar28 + 1;
  uVar21 = uVar25 + 1;
  uVar26 = uVar29 + 1;
  goto LAB_0017901e;
LAB_0017943e:
  uVar22 = local_d0;
  local_1a8 = (_Base_ptr)0x3ff0000000000000;
  if (((double)local_118 != 1.0) || (NAN((double)local_118))) {
    if ((uVar29 < (ulong)(local_178._8_8_ - local_178._0_8_)) &&
       (*(char *)(local_178._0_8_ + uVar29) != 'S')) {
      pp_Var17 = (_func_int **)local_178._0_8_;
      pcVar18 = (pointer)local_178._8_8_;
      uVar22 = local_190;
      for (; uVar29 < (ulong)((long)pcVar18 - (long)pp_Var17); uVar29 = uVar29 + 1) {
        if (*(char *)((long)pp_Var17 + uVar29) == 'M') {
          j_global = (int)uVar22 + iVar10;
          if (((((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> *
                 )(local_158._32_8_ + 0x40))->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left
               != local_180) &&
             (cVar15 = std::
                       _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                       ::find((_Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                               *)local_178._24_8_,&j_global), cVar15._M_node != local_180)) {
            pmVar16 = std::
                      map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                      ::at((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                            *)local_178._24_8_,&j_global);
            dVar30 = log(*pmVar16);
            local_198 = local_198 + dVar30;
          }
          uVar22 = (ulong)((int)uVar22 + 1);
          pp_Var17 = (_func_int **)local_178._0_8_;
          pcVar18 = (pointer)local_178._8_8_;
        }
        else if (*(char *)((long)pp_Var17 + uVar29) == 'S') break;
      }
    }
    else if ((uVar25 < (ulong)(local_158._8_8_ - local_158._0_8_)) &&
            (*(char *)(local_158._0_8_ + uVar25) != 'S')) {
      pp_Var17 = (_func_int **)local_158._0_8_;
      pcVar18 = (pointer)local_158._8_8_;
      dVar30 = (double)local_158._24_8_;
      for (; uVar25 < (ulong)((long)pcVar18 - (long)pp_Var17); uVar25 = uVar25 + 1) {
        if (*(char *)((long)pp_Var17 + uVar25) == 'M') {
          j_global = SUB84(dVar30,0) + (int)uVar22;
          if (((((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> *
                 )(local_158._32_8_ + 0x40))->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left
               != local_180) &&
             (cVar15 = std::
                       _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                       ::find((_Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                               *)local_178._24_8_,&j_global), cVar15._M_node != local_180)) {
            pmVar16 = std::
                      map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                      ::at((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                            *)local_178._24_8_,&j_global);
            dVar31 = log(*pmVar16);
            local_198 = local_198 + dVar31;
          }
          dVar30 = (double)(ulong)(SUB84(dVar30,0) + 1);
          pp_Var17 = (_func_int **)local_158._0_8_;
          pcVar18 = (pointer)local_158._8_8_;
        }
        else if (*(char *)((long)pp_Var17 + uVar25) == 'S') break;
      }
    }
    dVar30 = exp(local_198);
    local_1a8 = (_Base_ptr)pow(dVar30,1.0 / (double)local_120);
  }
LAB_001794c8:
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            ((_Vector_base<char,_std::allocator<char>_> *)local_158);
  ShortDnaSequence::~ShortDnaSequence(&sequence2);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            ((_Vector_base<char,_std::allocator<char>_> *)local_178);
  ShortDnaSequence::~ShortDnaSequence(&sequence1);
  return (double)local_1a8;
}

Assistant:

double QuasispeciesEdgeCalculator::singleOverlap(const AlignmentRecord & ap1, const AlignmentRecord & ap2, int strain1, int strain2, double MIN_OVERLAP, const double cutoff) const {
    int e1 = 0;
    int s1 = 0;
    ShortDnaSequence sequence1;
    vector<char> cigar1;

    int e2 = 0;
    int s2 = 0;
    ShortDnaSequence sequence2;
    vector<char> cigar2;

    if (strain1 == 1) {
        s1 = ap1.getStart1();
        e1 = ap1.getEnd1();
        sequence1 = ap1.getSequence1();
        cigar1 = ap1.getCigar1Unrolled();
    } else if (strain1 == 2) {
        s1 = ap1.getStart2();
        e1 = ap1.getEnd2();
        sequence1 = ap1.getSequence2();
        cigar1 = ap1.getCigar2Unrolled();
    }
    if (strain2 == 1) {
        s2 = ap2.getStart1();
        e2 = ap2.getEnd1();
        sequence2 = ap2.getSequence1();
        cigar2 = ap2.getCigar1Unrolled();
    } else if (strain2 == 2) {
        s2 = ap2.getStart2();
        e2 = ap2.getEnd2();
        sequence2 = ap2.getSequence2();
        cigar2 = ap2.getCigar2Unrolled();
    }

    if (s2 < s1) {
        std::swap(s1,s2);
        std::swap(e1,e2);
        std::swap(sequence1,sequence2);
        std::swap(cigar1,cigar2);
    }

    // ====
    // compute overlap
    int offset1 = 0;
    int offset2 = 0;
    int overlap = 0;
    computeOffsets(s1, s2, e1, e2, offset1, offset2, overlap);

    if (offset2 > 0) {
        //cerr << "offset 2: " << offset2 << endl;
    }
    //cerr << "offset 1: " << offset1 << endl;
    //cerr << "offset 2: " << offset2 << endl;
    //cerr << "single overlap: " << overlap << endl;
    if (overlap < MIN_OVERLAP) {
        return 0;
    }

    // ====
    //Offsets for the deletions and insertions that occured
    //upstream of the overlap. They cause index errors if not fixed.
    int offset_deletion1_ = 0;
    int offset_deletion2_ = 0;

    double overlap_probability = 0.0;
    char alphabet[] = {'A', 'C', 'G', 'T'};
    double hamming = 0;
    double total_size = 0;
    if (offset1 >= sequence1.size() || offset2 >= sequence2.size()) {
        return 0;
    }
    ////cerr << offset1 << " offset " << offset2 << endl;
    bool perfect = cutoff == 1.0;

    unsigned long j_seq = 0, j_seq2 = 0;
    unsigned long j_cigar = 0, j_cigar2 = 0;
    int j = 0, j2 = 0;
    for (;;) {
        if(j_cigar < cigar1.size() && j_cigar2 < cigar2.size()) {

            if (cigar1[j_cigar] != 'S' && cigar2[j_cigar2] != 'S' && cigar1[j_cigar] != 'H' && cigar2[j_cigar2] != 'H') break;
            if (cigar1[j_cigar] == 'S') { j_cigar++; j_seq++; }
            if (cigar2[j_cigar2] == 'S') { j_cigar2++; j_seq2++; }
            if (cigar1[j_cigar] == 'H') { j_cigar++; }
            if (cigar2[j_cigar2] == 'H') { j_cigar2++; }
        }
    }
    for (int j_prefix = 0;;) {
        if (j_prefix == offset1) break;
        if(j_cigar >= cigar1.size()) {
            int _ = 0;
            j_cigar++;
            j_prefix++;
            continue;
        }
        switch (cigar1[j_cigar]) {
            case 'M': 
                if (!perfect) {
                    int j_global = s1+j;
                    if (this->SIMPSON_MAP.begin() != this->SIMPSON_MAP.end()
                        && this->SIMPSON_MAP.find(j_global) != this->SIMPSON_MAP.end()) {
                        overlap_probability += log(this->SIMPSON_MAP.at(j_global));
                        //cerr << overlap_probability << endl;
                    }
                }
                j++;
            case 'I':
                j_seq++;
            default: break;
        }
        j_cigar++;
        j_prefix++;
    }
    for (;j_cigar<cigar1.size() && j_cigar2<cigar2.size() && cigar1[j_cigar] != 'S' && cigar2[j_cigar2] != 'S' && j_seq < sequence1.size() && j_seq2 < sequence2.size();) {
        //cerr << cigar1[j_cigar] << cigar2[j_cigar2] << "\t"; 
        if (perfect) {
            if (sequence1[j_seq] != sequence2[j_seq2]) return 0;
            else {
                j_cigar++;
                j_cigar2++;
                j_seq++;
                j_seq2++;
            }
        } else if (cigar1[j_cigar] == cigar2[j_cigar2] && (cigar1[j_cigar] == 'M' || cigar1[j_cigar] == 'I')) {

            //cerr << sequence1[j_seq] << ":" << sequence2[j_seq2];
            double q_x1 = sequence1.qualityCorrect(j_seq);
            // if (q_x1 < 0.001) {
            //     q_x1 = 0.001;
            // }
            double q_x2 = sequence2.qualityCorrect(j_seq2);
            // if (q_x2 < 0.001) {
            //     q_x2 = 0.001;
            // }
            //cerr << "\t" << q_x1 << ":" << q_x2 << "\t";
            double anti_q_x1 = (1.0 - q_x1) / 3.0;
            double anti_q_x2 = (1.0 - q_x2) / 3.0;
            assert(q_x1 <= 1 && q_x2 <= 1);
            double sum = 0.0;
            sum += ((sequence1[j_seq] == alphabet[0] ? q_x1 : anti_q_x1) * (sequence2[j_seq2] == alphabet[0] ? q_x2 : anti_q_x2));
            sum += ((sequence1[j_seq] == alphabet[1] ? q_x1 : anti_q_x1) * (sequence2[j_seq2] == alphabet[1] ? q_x2 : anti_q_x2));
            sum += ((sequence1[j_seq] == alphabet[2] ? q_x1 : anti_q_x1) * (sequence2[j_seq2] == alphabet[2] ? q_x2 : anti_q_x2));
            sum += ((sequence1[j_seq] == alphabet[3] ? q_x1 : anti_q_x1) * (sequence2[j_seq2] == alphabet[3] ? q_x2 : anti_q_x2));
            overlap_probability += log(sum);
            //cerr << "\t" << overlap_probability;
            total_size++;

            //cerr << sum << "\t";
            //cerr << ((sequence1[j_seq] == alphabet[0] ? q_x1 : anti_q_x1)) << ":" << ((sequence2[j_seq2] == alphabet[0] ? q_x2 : anti_q_x2)) << "\t";
            //cerr << ((sequence1[j_seq] == alphabet[1] ? q_x1 : anti_q_x1)) << ":" << ((sequence2[j_seq2] == alphabet[1] ? q_x2 : anti_q_x2)) << "\t";
            //cerr << ((sequence1[j_seq] == alphabet[2] ? q_x1 : anti_q_x1)) << ":" << ((sequence2[j_seq2] == alphabet[2] ? q_x2 : anti_q_x2)) << "\t";
            //cerr << ((sequence1[j_seq] == alphabet[3] ? q_x1 : anti_q_x1)) << ":" << ((sequence2[j_seq2] == alphabet[3] ? q_x2 : anti_q_x2)) << "\t";

            j_cigar++;
            j_cigar2++;
            j_seq++;
            j_seq2++;

            if (j_cigar < cigar1.size() && cigar1[j_cigar] == 'M') {
                j++;
                j2++;
            } 
        } else if (cigar1[j_cigar] == cigar2[j_cigar2] && cigar1[j_cigar] == 'D') {
            j_cigar++;
            j_cigar2++;
        }else if (this->FRAMESHIFT_MERGE) {
            if (cigar2[j_cigar2] == 'M') {
                switch(cigar1[j_cigar]) {
                    case 'D':
                        //cerr << "-:" << sequence2[j_seq2];  
                        j_cigar++;
                        j_cigar2++;
                        j_seq2++;
                        j2++;
                        break;
                    case 'I':
                        //cerr << sequence1[j_seq] << ":-";  
                        j_cigar++;
                        j_seq++;
                        break;
                    default: break;
                }
            } else if (cigar1[j_cigar] == 'M') {
                switch(cigar2[j_cigar2]) {
                    case 'D':
                        //cerr << sequence1[j_seq] << ":-";  
                        j_cigar2++;
                        j_cigar++;
                        j_seq++;
                        j++;
                        break;
                    case 'I':
                        //cerr << "-:" << sequence2[j_seq2];  
                        j_cigar2++;
                        j_seq2++;
                        break;
                }
            } else {
                //cerr << "DOES NOT MATCH" << endl;
                return 0;
            }
        } else {
            return 0;
        }
        //cerr << endl;
    }
    if (!perfect) {
        if (j_cigar < cigar1.size() && cigar1[j_cigar] != 'S') {
            for (;j_cigar<cigar1.size();) {
                if (cigar1[j_cigar] == 'S') break;
                if (cigar1[j_cigar] == 'M') {
                    int j_global = s1+j;
                    if (this->SIMPSON_MAP.begin() != this->SIMPSON_MAP.end()
                        && this->SIMPSON_MAP.find(j_global) != this->SIMPSON_MAP.end()) {
                        overlap_probability += log(this->SIMPSON_MAP.at(j_global));
                        //cerr << overlap_probability << endl;
                    }
                    j++;
                }
                j_cigar++;
            }
        } else if (j_cigar2 < cigar2.size() && cigar2[j_cigar2] != 'S') {
            for (;j_cigar2<cigar2.size();) {
                if (cigar2[j_cigar2] == 'S') break;
                if (cigar2[j_cigar2] == 'M') {
                    //if (j_cigar >= 26){
                    //    cerr << s2 << endl;
                    //    cerr << j2 << endl;
                    //    cerr << s2+j2 << endl;
                    //}
                    int j_global = s2+j2;
                    if (this->SIMPSON_MAP.begin() != this->SIMPSON_MAP.end()
                        && this->SIMPSON_MAP.find(j_global) != this->SIMPSON_MAP.end()) {
                        overlap_probability += log(this->SIMPSON_MAP.at(j_global));
                        //cerr << overlap_probability << endl;
                    }
                    j2++;
                }
                j_cigar2++;
            }
        }
    }
    //cerr << pow(exp(overlap_probability),1.0/total_size) << endl;
    if (perfect) return 1;
    return pow(exp(overlap_probability),1.0/total_size);
}